

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_23::RecordMessageNames
          (anon_unknown_23 *this,DescriptorProto *desc_proto,string_view prefix,
          btree_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *output)

{
  int iVar1;
  long lVar2;
  Rep *pRVar3;
  undefined8 extraout_RAX;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *pRVar4;
  string_view prefix_00;
  string full_name;
  string local_d0;
  pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  local_b0 [2];
  AlphaNum local_80;
  AlphaNum local_50;
  
  prefix_00._M_str =
       (btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
        *)prefix._M_str;
  if (((byte)this[0x10] & 1) == 0) {
    protobuf::_GLOBAL__N_1::RecordMessageNames((_GLOBAL__N_1 *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (desc_proto == (DescriptorProto *)0x0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    lVar2 = *(long *)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,lVar2,
               ((long *)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc))[1] + lVar2);
  }
  else {
    local_50.piece_._M_len = 1;
    local_50.piece_._M_str = ".";
    local_80.piece_._M_str = *(char **)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc);
    local_80.piece_._M_len = ((undefined8 *)(*(ulong *)(this + 0xd8) & 0xfffffffffffffffc))[1];
    local_b0[0].first.node_ =
         (btree_node<absl::lts_20250127::container_internal::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
          *)desc_proto;
    local_b0[0].first._8_8_ = prefix._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_d0,(lts_20250127 *)local_b0,&local_50,&local_80,(AlphaNum *)output);
  }
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>,256,false>>
  ::insert_unique<std::__cxx11::string,std::__cxx11::string_const&>
            (local_b0,prefix_00._M_str,&local_d0,&local_d0);
  this_00 = (RepeatedPtrFieldBase *)(this + 0x30);
  pRVar4 = this_00;
  if (((byte)this[0x30] & 1) != 0) {
    pRVar3 = protobuf::internal::RepeatedPtrFieldBase::rep(this_00);
    pRVar4 = (RepeatedPtrFieldBase *)pRVar3->elements;
    if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
      pRVar3 = protobuf::internal::RepeatedPtrFieldBase::rep(this_00);
      this_00 = (RepeatedPtrFieldBase *)pRVar3->elements;
    }
  }
  iVar1 = *(int *)(this + 0x38);
  for (; pRVar4 != (RepeatedPtrFieldBase *)(&this_00->tagged_rep_or_elem_ + iVar1);
      pRVar4 = (RepeatedPtrFieldBase *)&pRVar4->current_size_) {
    prefix_00._M_len = (size_t)local_d0._M_dataplus._M_p;
    RecordMessageNames((anon_unknown_23 *)pRVar4->tagged_rep_or_elem_,
                       (DescriptorProto *)local_d0._M_string_length,prefix_00,output);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RecordMessageNames(const DescriptorProto& desc_proto,
                        absl::string_view prefix,
                        absl::btree_set<std::string>* output) {
  ABSL_CHECK(desc_proto.has_name());
  std::string full_name = prefix.empty()
                              ? desc_proto.name()
                              : absl::StrCat(prefix, ".", desc_proto.name());
  output->insert(full_name);

  for (const auto& d : desc_proto.nested_type()) {
    RecordMessageNames(d, full_name, output);
  }
}